

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_intrin_avx2.c
# Opt level: O0

void av1_block_error_block_size16_avx2(int16_t *coeff,int16_t *dqcoeff,__m256i *sse_256)

{
  undefined1 auVar1 [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i error_hi;
  __m256i error;
  __m256i diff;
  __m256i _dqcoeff;
  __m256i _coeff;
  undefined8 uStack_178;
  
  auVar1 = vpsubw_avx2(*in_RSI,*in_RDI);
  auVar1 = vpmaddwd_avx2(auVar1,auVar1);
  auVar1 = vphaddd_avx2(auVar1,auVar1);
  uStack_178 = SUB328(ZEXT832(0),4);
  auVar1 = vpunpckldq_avx2(auVar1,ZEXT832(uStack_178) << 0x40);
  *in_RDX = auVar1;
  return;
}

Assistant:

static inline void av1_block_error_block_size16_avx2(const int16_t *coeff,
                                                     const int16_t *dqcoeff,
                                                     __m256i *sse_256) {
  const __m256i _coeff = _mm256_loadu_si256((const __m256i *)coeff);
  const __m256i _dqcoeff = _mm256_loadu_si256((const __m256i *)dqcoeff);
  // d0 d1 d2 d3 d4 d5 d6 d7 d8 d9 d10 d11 d12 d13 d14 d15
  const __m256i diff = _mm256_sub_epi16(_dqcoeff, _coeff);
  // r0 r1 r2 r3 r4 r5 r6 r7
  const __m256i error = _mm256_madd_epi16(diff, diff);
  // r0+r1 r2+r3 | r0+r1 r2+r3 | r4+r5 r6+r7 | r4+r5 r6+r7
  const __m256i error_hi = _mm256_hadd_epi32(error, error);
  // r0+r1 | r2+r3 | r4+r5 | r6+r7
  *sse_256 = _mm256_unpacklo_epi32(error_hi, _mm256_setzero_si256());
}